

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

CharFormat testing::internal::PrintAsCharLiteralTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  ostream *poVar1;
  bool bVar2;
  int value;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ostream *local_18;
  ostream *os_local;
  wchar_t c_local;
  
  local_18 = os;
  os_local._0_4_ = c;
  switch(c) {
  case L'\0':
    std::operator<<(os,"\\0");
    break;
  default:
    bVar2 = IsPrintableAscii(c);
    poVar1 = local_18;
    if (!bVar2) {
      String::FormatHexInt_abi_cxx11_(&local_58,(String *)(ulong)(uint)(wchar_t)os_local,value);
      std::operator+(&local_38,"\\x",&local_58);
      std::operator<<(poVar1,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      return kHexEscape;
    }
    std::operator<<(local_18,(char)(wchar_t)os_local);
    return kAsIs;
  case L'\a':
    std::operator<<(os,"\\a");
    break;
  case L'\b':
    std::operator<<(os,"\\b");
    break;
  case L'\t':
    std::operator<<(os,"\\t");
    break;
  case L'\n':
    std::operator<<(os,"\\n");
    break;
  case L'\v':
    std::operator<<(os,"\\v");
    break;
  case L'\f':
    std::operator<<(os,"\\f");
    break;
  case L'\r':
    std::operator<<(os,"\\r");
    break;
  case L'\'':
    std::operator<<(os,"\\\'");
    break;
  case L'\\':
    std::operator<<(os,"\\\\");
  }
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  switch (static_cast<wchar_t>(c)) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        *os << "\\x" + String::FormatHexInt(static_cast<UnsignedChar>(c));
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}